

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.cc
# Opt level: O3

int __thiscall
webrtc::Resampler::Push
          (Resampler *this,int16_t *samplesIn,size_t lengthIn,int16_t *samplesOut,size_t maxLen,
          size_t *outLen)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int16_t *piVar11;
  int16_t *piVar12;
  int16_t *samplesOut_00;
  int16_t *samplesOut_01;
  ulong uVar13;
  int32_t *piVar14;
  int32_t *piVar15;
  int iVar16;
  size_t sVar17;
  int32_t *piVar18;
  ulong uVar19;
  ulong uVar20;
  size_t actualOutLen_right;
  size_t actualOutLen_left;
  int32_t *local_68;
  ulong local_50;
  size_t local_40;
  size_t local_38;
  
  if (this->num_channels_ == 2) {
    piVar11 = (int16_t *)malloc(lengthIn & 0x7fffffffffffffff);
    piVar12 = (int16_t *)malloc(lengthIn & 0x7fffffffffffffff);
    samplesOut_00 = (int16_t *)malloc(maxLen & 0xfffffffffffffffe);
    samplesOut_01 = (int16_t *)malloc(maxLen & 0xfffffffffffffffe);
    if (lengthIn != 0) {
      uVar13 = 0;
      do {
        *(int16_t *)((long)piVar11 + uVar13) = samplesIn[uVar13];
        *(int16_t *)((long)piVar12 + uVar13) = samplesIn[uVar13 + 1];
        uVar13 = uVar13 + 2;
      } while (uVar13 < lengthIn);
    }
    local_38 = 0;
    local_40 = 0;
    iVar9 = Push(this->slave_left_,piVar11,lengthIn >> 1,samplesOut_00,maxLen >> 1,&local_38);
    iVar10 = Push(this->slave_right_,piVar12,lengthIn >> 1,samplesOut_01,maxLen >> 1,&local_40);
    iVar16 = -1;
    if ((iVar10 == 0 && iVar9 == 0) && (local_38 == local_40)) {
      if (local_38 != 0) {
        sVar17 = 0;
        do {
          samplesOut[sVar17 * 2] = samplesOut_00[sVar17];
          samplesOut[sVar17 * 2 + 1] = samplesOut_01[sVar17];
          sVar17 = sVar17 + 1;
        } while (local_38 != sVar17);
      }
      *outLen = local_38 * 2;
      iVar16 = 0;
    }
    free(piVar11);
    free(piVar12);
    free(samplesOut_00);
    free(samplesOut_01);
    return iVar16;
  }
  switch(this->my_mode_) {
  case kResamplerMode1To1:
    memcpy(samplesOut,samplesIn,lengthIn * 2);
    *outLen = lengthIn;
    return 0;
  case kResamplerMode1To2:
    uVar13 = lengthIn * 2;
    if (maxLen < uVar13) {
      return -1;
    }
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
    goto LAB_00145b45;
  case kResamplerMode1To3:
    if (0x199999999999999 <
        (lengthIn * -0x3333333333333333 >> 5 | lengthIn * -0x3333333333333333 << 0x3b)) {
      return -1;
    }
    local_68 = (int32_t *)(lengthIn * 3);
    if (maxLen < local_68) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(0x540);
    if (lengthIn != 0) {
      uVar13 = 0;
      do {
        WebRtcSpl_Resample16khzTo48khz
                  (samplesIn,samplesOut,(WebRtcSpl_State16khzTo48khz *)this->state1_,piVar14);
        uVar13 = uVar13 + 0xa0;
        samplesIn = samplesIn + 0xa0;
        samplesOut = samplesOut + 0x1e0;
      } while (uVar13 < lengthIn);
    }
    goto LAB_001461db;
  case kResamplerMode1To4:
    uVar13 = lengthIn * 4;
    if (maxLen <= uVar13 && uVar13 - maxLen != 0) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(uVar13);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)piVar14,(int32_t *)this->state1_);
    WebRtcSpl_UpsampleBy2((int16_t *)piVar14,lengthIn * 2,samplesOut,(int32_t *)this->state2_);
    *outLen = uVar13;
    break;
  case kResamplerMode1To6:
    if (0x333333333333333 <
        (lengthIn * -0x3333333333333333 >> 4 | lengthIn * -0x3333333333333333 << 0x3c)) {
      return -1;
    }
    if (maxLen < lengthIn * 6) {
      return -1;
    }
    piVar15 = (int32_t *)malloc(0x540);
    piVar14 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)piVar14,(int32_t *)this->state1_);
    *outLen = lengthIn * 2;
    if (lengthIn * 2 == 0) {
      sVar17 = 0;
    }
    else {
      uVar13 = 0;
      piVar18 = piVar14;
      do {
        WebRtcSpl_Resample16khzTo48khz
                  ((int16_t *)piVar18,samplesOut,(WebRtcSpl_State16khzTo48khz *)this->state2_,
                   piVar15);
        uVar13 = uVar13 + 0xa0;
        piVar18 = piVar18 + 0x50;
        samplesOut = samplesOut + 0x1e0;
      } while (uVar13 < *outLen);
      sVar17 = *outLen * 3;
    }
    *outLen = sVar17;
    free(piVar15);
    break;
  case kResamplerMode1To12:
    if (0x666666666666666 <
        (lengthIn * -0x3333333333333333 >> 3 | lengthIn * -0x3333333333333333 << 0x3d)) {
      return -1;
    }
    if (maxLen < lengthIn * 0xc) {
      return -1;
    }
    piVar15 = (int32_t *)malloc(0x540);
    piVar14 = (int32_t *)malloc(lengthIn * 8);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
    *outLen = lengthIn * 2;
    WebRtcSpl_UpsampleBy2(samplesOut,lengthIn * 2,(int16_t *)piVar14,(int32_t *)this->state2_);
    sVar17 = *outLen;
    *outLen = sVar17 * 2;
    if (sVar17 * 2 == 0) {
      sVar17 = 0;
    }
    else {
      uVar13 = 0;
      piVar18 = piVar14;
      do {
        WebRtcSpl_Resample16khzTo48khz
                  ((int16_t *)piVar18,samplesOut,(WebRtcSpl_State16khzTo48khz *)this->state3_,
                   piVar15);
        uVar13 = uVar13 + 0xa0;
        piVar18 = piVar18 + 0x50;
        samplesOut = samplesOut + 0x1e0;
      } while (uVar13 < *outLen);
      sVar17 = *outLen * 3;
    }
    *outLen = sVar17;
    free(piVar15);
    break;
  case kResamplerMode2To3:
    local_50 = lengthIn * 3 >> 1;
    if (0x199999999999999 <
        (lengthIn * -0x3333333333333333 >> 5 | lengthIn * -0x3333333333333333 << 0x3b) ||
        maxLen < local_50) {
      return -1;
    }
    piVar15 = (int32_t *)malloc(lengthIn * 6);
    piVar14 = (int32_t *)malloc(0x540);
    if (lengthIn != 0) {
      uVar13 = 0;
      piVar18 = piVar15;
      do {
        WebRtcSpl_Resample16khzTo48khz
                  (samplesIn,(int16_t *)piVar18,(WebRtcSpl_State16khzTo48khz *)this->state1_,piVar14
                  );
        uVar13 = uVar13 + 0xa0;
        samplesIn = samplesIn + 0xa0;
        piVar18 = piVar18 + 0xf0;
      } while (uVar13 < lengthIn);
    }
    WebRtcSpl_DownsampleBy2((int16_t *)piVar15,lengthIn * 3,samplesOut,(int32_t *)this->state2_);
    goto LAB_00145f1c;
  case kResamplerMode2To11:
    if (0x333333333333333 <
        (lengthIn * -0x3333333333333333 >> 4 | lengthIn * -0x3333333333333333 << 0x3c)) {
      return -1;
    }
    if (maxLen < lengthIn * 0xb >> 1) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)piVar14,(int32_t *)this->state1_);
    piVar15 = (int32_t *)malloc(0x188);
    if (lengthIn * 2 != 0) {
      uVar20 = 0;
      uVar13 = 0;
      piVar18 = piVar14;
      do {
        WebRtcSpl_Resample8khzTo22khz
                  ((int16_t *)piVar18,(int16_t *)((uVar20 >> 1) + (long)samplesOut),
                   (WebRtcSpl_State8khzTo22khz *)this->state2_,piVar15);
        uVar13 = uVar13 + 0x50;
        uVar20 = uVar20 + 0x370;
        piVar18 = piVar18 + 0x28;
      } while (uVar13 < lengthIn * 2);
    }
    *outLen = lengthIn * 0x16 >> 2;
    free(piVar15);
    break;
  case kResamplerMode4To11:
    if (0x333333333333333 <
        (lengthIn * -0x3333333333333333 >> 4 | lengthIn * -0x3333333333333333 << 0x3c)) {
      return -1;
    }
    local_68 = (int32_t *)(lengthIn * 0xb >> 2);
    if (maxLen < local_68) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(0x188);
    if (lengthIn != 0) {
      uVar20 = 0;
      uVar13 = 0;
      do {
        WebRtcSpl_Resample8khzTo22khz
                  (samplesIn,(int16_t *)((uVar20 >> 1) + (long)samplesOut),
                   (WebRtcSpl_State8khzTo22khz *)this->state1_,piVar14);
        uVar13 = uVar13 + 0x50;
        uVar20 = uVar20 + 0x370;
        samplesIn = samplesIn + 0x50;
      } while (uVar13 < lengthIn);
    }
    goto LAB_001461db;
  case kResamplerMode8To11:
    if (0x199999999999999 <
        (lengthIn * -0x3333333333333333 >> 5 | lengthIn * -0x3333333333333333 << 0x3b)) {
      return -1;
    }
    local_68 = (int32_t *)(lengthIn * 0xb >> 3);
    if (maxLen < local_68) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(0x160);
    if (lengthIn != 0) {
      uVar20 = 0;
      uVar13 = 0;
      do {
        WebRtcSpl_Resample16khzTo22khz
                  (samplesIn,(int16_t *)((uVar20 >> 2) + (long)samplesOut),
                   (WebRtcSpl_State16khzTo22khz *)this->state1_,piVar14);
        uVar13 = uVar13 + 0xa0;
        uVar20 = uVar20 + 0x6e0;
        samplesIn = samplesIn + 0xa0;
      } while (uVar13 < lengthIn);
    }
LAB_001461db:
    *outLen = (size_t)local_68;
    break;
  case kResamplerMode11To16:
    if (0x253c8253c8253c8 <
        (lengthIn * 0x6fb586fb586fb587 >> 1 |
        (ulong)((lengthIn * 0x6fb586fb586fb587 & 1) != 0) << 0x3f)) {
      return -1;
    }
    uVar13 = (lengthIn << 4) / 0xb;
    if (maxLen < uVar13) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(0x1a0);
    local_68 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)local_68,(int32_t *)this->state1_);
    if (lengthIn * 2 != 0) {
      uVar20 = 0;
      piVar15 = local_68;
      do {
        WebRtcSpl_Resample22khzTo16khz
                  ((int16_t *)piVar15,samplesOut + (uVar20 / 0xdc) * 0xa0,
                   (WebRtcSpl_State22khzTo16khz *)this->state2_,piVar14);
        uVar20 = uVar20 + 0xdc;
        piVar15 = piVar15 + 0x6e;
      } while (uVar20 < lengthIn * 2);
    }
    *outLen = uVar13;
    goto LAB_0014634d;
  case kResamplerMode11To32:
    if (0x253c8253c8253c8 <
        (lengthIn * 0x6fb586fb586fb587 >> 1 |
        (ulong)((lengthIn * 0x6fb586fb586fb587 & 1) != 0) << 0x3f)) {
      return -1;
    }
    local_50 = (lengthIn << 5) / 0xb;
    if (maxLen < local_50) {
      return -1;
    }
    piVar15 = (int32_t *)malloc(0x1a0);
    piVar14 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
    if (lengthIn * 2 != 0) {
      uVar13 = 0;
      piVar11 = samplesOut;
      do {
        WebRtcSpl_Resample22khzTo16khz
                  (piVar11,(int16_t *)(piVar14 + (uVar13 / 0xdc) * 0x50),
                   (WebRtcSpl_State22khzTo16khz *)this->state2_,piVar15);
        uVar13 = uVar13 + 0xdc;
        piVar11 = piVar11 + 0xdc;
      } while (uVar13 < lengthIn * 2);
    }
    WebRtcSpl_UpsampleBy2
              ((int16_t *)piVar14,(lengthIn << 4) / 0xb,samplesOut,(int32_t *)this->state3_);
LAB_00145f1c:
    *outLen = local_50;
LAB_00146040:
    free(piVar15);
    break;
  case kResamplerMode2To1:
    uVar13 = lengthIn >> 1;
    if (maxLen < uVar13) {
      return -1;
    }
    WebRtcSpl_DownsampleBy2(samplesIn,lengthIn,samplesOut,(int32_t *)this->state1_);
LAB_00145b45:
    *outLen = uVar13;
    return 0;
  case kResamplerMode3To1:
    if (0x88888888888888 <
        (lengthIn * -0x1111111111111111 >> 5 | lengthIn * -0x1111111111111111 << 0x3b)) {
      return -1;
    }
    local_68 = (int32_t *)(lengthIn / 3);
    if (maxLen < local_68) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(0x7c0);
    if (lengthIn != 0) {
      uVar13 = 0;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar13;
        WebRtcSpl_Resample48khzTo16khz
                  (samplesIn,
                   (int16_t *)
                   ((SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) +
                   (long)samplesOut),(WebRtcSpl_State48khzTo16khz *)this->state1_,piVar14);
        uVar13 = uVar13 + 0x1e0;
        samplesIn = samplesIn + 0x1e0;
      } while (uVar13 < lengthIn);
    }
    goto LAB_001462ab;
  case kResamplerMode4To1:
    if (maxLen < lengthIn >> 2) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(lengthIn & 0x7fffffffffffffff);
    WebRtcSpl_DownsampleBy2(samplesIn,lengthIn,(int16_t *)piVar14,(int32_t *)this->state1_);
    WebRtcSpl_DownsampleBy2((int16_t *)piVar14,lengthIn >> 1,samplesOut,(int32_t *)this->state2_);
    *outLen = lengthIn >> 2;
    break;
  case kResamplerMode6To1:
    if (0x88888888888888 <
        (lengthIn * -0x1111111111111111 >> 5 | lengthIn * -0x1111111111111111 << 0x3b)) {
      return -1;
    }
    if (lengthIn / 6 <= maxLen) {
      piVar14 = (int32_t *)malloc(0x7c0);
      piVar11 = (int16_t *)malloc((lengthIn * 2) / 3);
      if (lengthIn != 0) {
        uVar13 = 0;
        do {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar13;
          WebRtcSpl_Resample48khzTo16khz
                    (samplesIn,
                     (int16_t *)
                     ((SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) +
                     (long)piVar11),(WebRtcSpl_State48khzTo16khz *)this->state1_,piVar14);
          uVar13 = uVar13 + 0x1e0;
          samplesIn = samplesIn + 0x1e0;
        } while (uVar13 < lengthIn);
      }
      *outLen = lengthIn / 3;
      free(piVar14);
      WebRtcSpl_DownsampleBy2(piVar11,lengthIn / 3,samplesOut,(int32_t *)this->state2_);
      free(piVar11);
      *outLen = *outLen >> 1;
      return 0;
    }
    return -1;
  case kResamplerMode12To1:
    if (0x88888888888888 <
        (lengthIn * -0x1111111111111111 >> 5 | lengthIn * -0x1111111111111111 << 0x3b)) {
      return -1;
    }
    if (lengthIn / 0xc <= maxLen) {
      piVar14 = (int32_t *)malloc(0x7c0);
      piVar11 = (int16_t *)malloc((lengthIn * 2) / 3);
      piVar12 = (int16_t *)malloc((lengthIn * 2) / 6);
      if (lengthIn != 0) {
        uVar13 = 0;
        do {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar13;
          WebRtcSpl_Resample48khzTo16khz
                    (samplesIn,
                     (int16_t *)
                     ((SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) +
                     (long)piVar11),(WebRtcSpl_State48khzTo16khz *)this->state1_,piVar14);
          uVar13 = uVar13 + 0x1e0;
          samplesIn = samplesIn + 0x1e0;
        } while (uVar13 < lengthIn);
      }
      *outLen = lengthIn / 3;
      free(piVar14);
      WebRtcSpl_DownsampleBy2(piVar11,lengthIn / 3,piVar12,(int32_t *)this->state2_);
      uVar13 = *outLen;
      *outLen = uVar13 >> 1;
      free(piVar11);
      WebRtcSpl_DownsampleBy2(piVar12,uVar13 >> 1,samplesOut,(int32_t *)this->state3_);
      free(piVar12);
      *outLen = *outLen >> 1;
      return 0;
    }
    return -1;
  case kResamplerMode3To2:
    uVar13 = lengthIn * 2;
    if (maxLen < uVar13 / 3) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(lengthIn * 4);
    WebRtcSpl_UpsampleBy2(samplesIn,lengthIn,(int16_t *)piVar14,(int32_t *)this->state1_);
    if (0x88888888888888 <
        (lengthIn * -0x2222222222222222 >> 5 | lengthIn * -0x2222222222222222 << 0x3b)) {
      free(piVar14);
      return -1;
    }
    local_68 = (int32_t *)malloc(0x7c0);
    if (uVar13 != 0) {
      uVar20 = 0;
      piVar15 = piVar14;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar20;
        WebRtcSpl_Resample48khzTo16khz
                  ((int16_t *)piVar15,
                   (int16_t *)
                   ((SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfffffffffffffffe) +
                   (long)samplesOut),(WebRtcSpl_State48khzTo16khz *)this->state2_,local_68);
        uVar20 = uVar20 + 0x1e0;
        piVar15 = piVar15 + 0xf0;
      } while (uVar20 < uVar13);
    }
    *outLen = uVar13 / 3;
LAB_0014634d:
    free(piVar14);
    piVar14 = local_68;
    break;
  case kResamplerMode11To2:
    if (0x129e4129e4129e4 <
        (lengthIn * 0x6fb586fb586fb587 >> 2 | lengthIn * 0x6fb586fb586fb587 << 0x3e)) {
      return -1;
    }
    if (maxLen < (lengthIn * 2) / 0xb) {
      return -1;
    }
    piVar15 = (int32_t *)malloc(0x1f8);
    uVar13 = lengthIn * 4;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar13;
    piVar14 = (int32_t *)malloc(SUB168(auVar5 * ZEXT816(0x2e8ba2e8ba2e8ba3),8) & 0xfffffffffffffffe)
    ;
    if (lengthIn != 0) {
      uVar20 = 0;
      uVar19 = 0;
      do {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar20;
        WebRtcSpl_Resample22khzTo8khz
                  (samplesIn,
                   (int16_t *)
                   ((SUB168(auVar6 * ZEXT816(0x2e8ba2e8ba2e8ba3),8) & 0xfffffffffffffffe) +
                   (long)piVar14),(WebRtcSpl_State22khzTo8khz *)this->state1_,piVar15);
        uVar19 = uVar19 + 0xdc;
        samplesIn = samplesIn + 0xdc;
        uVar20 = uVar20 + 0x370;
      } while (uVar19 < lengthIn);
    }
    WebRtcSpl_DownsampleBy2((int16_t *)piVar14,uVar13 / 0xb,samplesOut,(int32_t *)this->state2_);
    *outLen = uVar13 / 0x16;
    goto LAB_00146040;
  case kResamplerMode11To4:
    if (0x129e4129e4129e4 <
        (lengthIn * 0x6fb586fb586fb587 >> 2 | lengthIn * 0x6fb586fb586fb587 << 0x3e)) {
      return -1;
    }
    local_68 = (int32_t *)((lengthIn * 4) / 0xb);
    if (maxLen < local_68) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(0x1f8);
    if (lengthIn != 0) {
      uVar20 = 0;
      uVar13 = 0;
      do {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar20;
        WebRtcSpl_Resample22khzTo8khz
                  (samplesIn,
                   (int16_t *)
                   ((SUB168(auVar7 * ZEXT816(0x2e8ba2e8ba2e8ba3),8) & 0xfffffffffffffffe) +
                   (long)samplesOut),(WebRtcSpl_State22khzTo8khz *)this->state1_,piVar14);
        uVar13 = uVar13 + 0xdc;
        samplesIn = samplesIn + 0xdc;
        uVar20 = uVar20 + 0x370;
      } while (uVar13 < lengthIn);
    }
    goto LAB_001462ab;
  case kResamplerMode11To8:
    if (0x129e4129e4129e4 <
        (lengthIn * 0x6fb586fb586fb587 >> 2 | lengthIn * 0x6fb586fb586fb587 << 0x3e)) {
      return -1;
    }
    local_68 = (int32_t *)((lengthIn * 8) / 0xb);
    if (maxLen < local_68) {
      return -1;
    }
    piVar14 = (int32_t *)malloc(0x1a0);
    if (lengthIn != 0) {
      uVar20 = 0;
      uVar13 = 0;
      do {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar20;
        WebRtcSpl_Resample22khzTo16khz
                  (samplesIn,
                   (int16_t *)
                   ((SUB168(auVar3 * ZEXT816(0x2e8ba2e8ba2e8ba3),8) & 0xfffffffffffffffe) +
                   (long)samplesOut),(WebRtcSpl_State22khzTo16khz *)this->state1_,piVar14);
        uVar13 = uVar13 + 0xdc;
        samplesIn = samplesIn + 0xdc;
        uVar20 = uVar20 + 0x6e0;
      } while (uVar13 < lengthIn);
    }
LAB_001462ab:
    *outLen = (size_t)local_68;
    break;
  default:
    goto switchD_00145353_default;
  }
  free(piVar14);
switchD_00145353_default:
  return 0;
}

Assistant:

int Resampler::Push(const int16_t * samplesIn, size_t lengthIn,
                    int16_t* samplesOut, size_t maxLen, size_t &outLen)
{
    if (num_channels_ == 2)
    {
        // Split up the signal and call the slave object for each channel
        int16_t* left = (int16_t*)malloc(lengthIn * sizeof(int16_t) / 2);
        int16_t* right = (int16_t*)malloc(lengthIn * sizeof(int16_t) / 2);
        int16_t* out_left = (int16_t*)malloc(maxLen / 2 * sizeof(int16_t));
        int16_t* out_right =
                (int16_t*)malloc(maxLen / 2 * sizeof(int16_t));
        int res = 0;
        for (size_t i = 0; i < lengthIn; i += 2)
        {
            left[i >> 1] = samplesIn[i];
            right[i >> 1] = samplesIn[i + 1];
        }

        // It's OK to overwrite the local parameter, since it's just a copy
        lengthIn = lengthIn / 2;

        size_t actualOutLen_left = 0;
        size_t actualOutLen_right = 0;
        // Do resampling for right channel
        res |= slave_left_->Push(left, lengthIn, out_left, maxLen / 2, actualOutLen_left);
        res |= slave_right_->Push(right, lengthIn, out_right, maxLen / 2, actualOutLen_right);
        if (res || (actualOutLen_left != actualOutLen_right))
        {
            free(left);
            free(right);
            free(out_left);
            free(out_right);
            return -1;
        }

        // Reassemble the signal
        for (size_t i = 0; i < actualOutLen_left; i++)
        {
            samplesOut[i * 2] = out_left[i];
            samplesOut[i * 2 + 1] = out_right[i];
        }
        outLen = 2 * actualOutLen_left;

        free(left);
        free(right);
        free(out_left);
        free(out_right);

        return 0;
    }

    // Containers for temp samples
    int16_t* tmp;
    int16_t* tmp_2;
    // tmp data for resampling routines
    int32_t* tmp_mem;

    switch (my_mode_)
    {
        case kResamplerMode1To1:
            memcpy(samplesOut, samplesIn, lengthIn * sizeof(int16_t));
            outLen = lengthIn;
            break;
        case kResamplerMode1To2:
            if (maxLen < (lengthIn * 2))
            {
                return -1;
            }
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);
            outLen = lengthIn * 2;
            return 0;
        case kResamplerMode1To3:

            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn * 3))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(samplesIn + i, samplesOut + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn * 3;
            free(tmp_mem);
            return 0;
        case kResamplerMode1To4:
            if (maxLen < (lengthIn * 4))
            {
                return -1;
            }

            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);
            // 1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            // 2:4
            WebRtcSpl_UpsampleBy2(tmp, lengthIn * 2, samplesOut, (int32_t*)state2_);
            outLen = lengthIn * 4;
            free(tmp);
            return 0;
        case kResamplerMode1To6:
            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn * 6))
            {
                return -1;
            }

            //1:2

            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));
            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);

            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            outLen = lengthIn * 2;

            for (size_t i = 0; i < outLen; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(tmp + i, samplesOut + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state2_,
                                               tmp_mem);
            }
            outLen = outLen * 3;
            free(tmp_mem);
            free(tmp);

            return 0;
        case kResamplerMode1To12:
            // We can only handle blocks of 40 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 40) != 0) {
              return -1;
            }
            if (maxLen < (lengthIn * 12)) {
              return -1;
            }

            tmp_mem = (int32_t*) malloc(336 * sizeof(int32_t));
            tmp = (int16_t*) malloc(sizeof(int16_t) * 4 * lengthIn);
            //1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut,
                                  (int32_t*) state1_);
            outLen = lengthIn * 2;
            //2:4
            WebRtcSpl_UpsampleBy2(samplesOut, outLen, tmp, (int32_t*) state2_);
            outLen = outLen * 2;
            // 4:12
            for (size_t i = 0; i < outLen; i += 160) {
              // WebRtcSpl_Resample16khzTo48khz() takes a block of 160 samples
              // as input and outputs a resampled block of 480 samples. The
              // data is now actually in 32 kHz sampling rate, despite the
              // function name, and with a resampling factor of three becomes
              // 96 kHz.
              WebRtcSpl_Resample16khzTo48khz(tmp + i, samplesOut + i * 3,
                                             (WebRtcSpl_State16khzTo48khz*) state3_,
                                             tmp_mem);
            }
            outLen = outLen * 3;
            free(tmp_mem);
            free(tmp);

            return 0;
        case kResamplerMode2To3:
            if (maxLen < (lengthIn * 3 / 2))
            {
                return -1;
            }
            // 2:6
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            tmp = static_cast<int16_t*> (malloc(sizeof(int16_t) * lengthIn * 3));
            tmp_mem = (int32_t*)malloc(336 * sizeof(int32_t));
            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo48khz(samplesIn + i, tmp + i * 3,
                                               (WebRtcSpl_State16khzTo48khz *)state1_,
                                               tmp_mem);
            }
            lengthIn = lengthIn * 3;
            // 6:3
            WebRtcSpl_DownsampleBy2(tmp, lengthIn, samplesOut, (int32_t*)state2_);
            outLen = lengthIn / 2;
            free(tmp);
            free(tmp_mem);
            return 0;
        case kResamplerMode2To11:

            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 2))
            {
                return -1;
            }
            tmp = (int16_t*)malloc(sizeof(int16_t) * 2 * lengthIn);
            // 1:2
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            lengthIn *= 2;

            tmp_mem = (int32_t*)malloc(98 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 80)
            {
                WebRtcSpl_Resample8khzTo22khz(tmp + i, samplesOut + (i * 11) / 4,
                                              (WebRtcSpl_State8khzTo22khz *)state2_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 11) / 4;
            free(tmp_mem);
            free(tmp);
            return 0;
        case kResamplerMode4To11:

            // We can only handle blocks of 80 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 80) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 4))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(98 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 80)
            {
                WebRtcSpl_Resample8khzTo22khz(samplesIn + i, samplesOut + (i * 11) / 4,
                                              (WebRtcSpl_State8khzTo22khz *)state1_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 11) / 4;
            free(tmp_mem);
            return 0;
        case kResamplerMode8To11:
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 160) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 11) / 8))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(88 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 160)
            {
                WebRtcSpl_Resample16khzTo22khz(samplesIn + i, samplesOut + (i * 11) / 8,
                                               (WebRtcSpl_State16khzTo22khz *)state1_,
                                               tmp_mem);
            }
            outLen = (lengthIn * 11) / 8;
            free(tmp_mem);
            return 0;

        case kResamplerMode11To16:
            // We can only handle blocks of 110 samples
            if ((lengthIn % 110) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 16) / 11))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn * 2));

            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);

            for (size_t i = 0; i < (lengthIn * 2); i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(tmp + i, samplesOut + (i / 220) * 160,
                                               (WebRtcSpl_State22khzTo16khz *)state2_,
                                               tmp_mem);
            }

            outLen = (lengthIn * 16) / 11;

            free(tmp_mem);
            free(tmp);
            return 0;

        case kResamplerMode11To32:

            // We can only handle blocks of 110 samples
            if ((lengthIn % 110) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 32) / 11))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn * 2));

            // 11 -> 22 kHz in samplesOut
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);

            // 22 -> 16 in tmp
            for (size_t i = 0; i < (lengthIn * 2); i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(samplesOut + i, tmp + (i / 220) * 160,
                                               (WebRtcSpl_State22khzTo16khz *)state2_,
                                               tmp_mem);
            }

            // 16 -> 32 in samplesOut
            WebRtcSpl_UpsampleBy2(tmp, (lengthIn * 16) / 11, samplesOut,
                                  (int32_t*)state3_);

            outLen = (lengthIn * 32) / 11;

            free(tmp_mem);
            free(tmp);
            return 0;

        case kResamplerMode2To1:
            if (maxLen < (lengthIn / 2))
            {
                return -1;
            }
            WebRtcSpl_DownsampleBy2(samplesIn, lengthIn, samplesOut, (int32_t*)state1_);
            outLen = lengthIn / 2;
            return 0;
        case kResamplerMode3To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn / 3))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(samplesIn + i, samplesOut + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            return 0;
        case kResamplerMode4To1:
            if (maxLen < (lengthIn / 4))
            {
                return -1;
            }
            tmp = (int16_t*)malloc(sizeof(int16_t) * lengthIn / 2);
            // 4:2
            WebRtcSpl_DownsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            // 2:1
            WebRtcSpl_DownsampleBy2(tmp, lengthIn / 2, samplesOut, (int32_t*)state2_);
            outLen = lengthIn / 4;
            free(tmp);
            return 0;

        case kResamplerMode6To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                return -1;
            }
            if (maxLen < (lengthIn / 6))
            {
                return -1;
            }

            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));
            tmp = (int16_t*)malloc((sizeof(int16_t) * lengthIn) / 3);

            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(samplesIn + i, tmp + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            WebRtcSpl_DownsampleBy2(tmp, outLen, samplesOut, (int32_t*)state2_);
            free(tmp);
            outLen = outLen / 2;
            return 0;
        case kResamplerMode12To1:
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0) {
              return -1;
            }
            if (maxLen < (lengthIn / 12)) {
              return -1;
            }

            tmp_mem = (int32_t*) malloc(496 * sizeof(int32_t));
            tmp = (int16_t*) malloc((sizeof(int16_t) * lengthIn) / 3);
            tmp_2 = (int16_t*) malloc((sizeof(int16_t) * lengthIn) / 6);
            // 12:4
            for (size_t i = 0; i < lengthIn; i += 480) {
              // WebRtcSpl_Resample48khzTo16khz() takes a block of 480 samples
              // as input and outputs a resampled block of 160 samples. The
              // data is now actually in 96 kHz sampling rate, despite the
              // function name, and with a resampling factor of 1/3 becomes
              // 32 kHz.
              WebRtcSpl_Resample48khzTo16khz(samplesIn + i, tmp + i / 3,
                                             (WebRtcSpl_State48khzTo16khz*) state1_,
                                             tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp_mem);
            // 4:2
            WebRtcSpl_DownsampleBy2(tmp, outLen, tmp_2, (int32_t*) state2_);
            outLen = outLen / 2;
            free(tmp);
            // 2:1
            WebRtcSpl_DownsampleBy2(tmp_2, outLen, samplesOut,
                                    (int32_t*) state3_);
            free(tmp_2);
            outLen = outLen / 2;
            return 0;
        case kResamplerMode3To2:
            if (maxLen < (lengthIn * 2 / 3))
            {
                return -1;
            }
            // 3:6
            tmp = static_cast<int16_t*> (malloc(sizeof(int16_t) * lengthIn * 2));
            WebRtcSpl_UpsampleBy2(samplesIn, lengthIn, tmp, (int32_t*)state1_);
            lengthIn *= 2;
            // 6:2
            // We can only handle blocks of 480 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 480) != 0)
            {
                free(tmp);
                return -1;
            }
            tmp_mem = (int32_t*)malloc(496 * sizeof(int32_t));
            for (size_t i = 0; i < lengthIn; i += 480)
            {
                WebRtcSpl_Resample48khzTo16khz(tmp + i, samplesOut + i / 3,
                                               (WebRtcSpl_State48khzTo16khz *)state2_,
                                               tmp_mem);
            }
            outLen = lengthIn / 3;
            free(tmp);
            free(tmp_mem);
            return 0;
        case kResamplerMode11To2:
            // We can only handle blocks of 220 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 2) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(126 * sizeof(int32_t));
            tmp = (int16_t*)malloc((lengthIn * 4) / 11 * sizeof(int16_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo8khz(samplesIn + i, tmp + (i * 4) / 11,
                                              (WebRtcSpl_State22khzTo8khz *)state1_,
                                              tmp_mem);
            }
            lengthIn = (lengthIn * 4) / 11;

            WebRtcSpl_DownsampleBy2(tmp, lengthIn, samplesOut,
                                    (int32_t*)state2_);
            outLen = lengthIn / 2;

            free(tmp_mem);
            free(tmp);
            return 0;
        case kResamplerMode11To4:
            // We can only handle blocks of 220 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 4) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(126 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo8khz(samplesIn + i, samplesOut + (i * 4) / 11,
                                              (WebRtcSpl_State22khzTo8khz *)state1_,
                                              tmp_mem);
            }
            outLen = (lengthIn * 4) / 11;
            free(tmp_mem);
            return 0;
        case kResamplerMode11To8:
            // We can only handle blocks of 160 samples
            // Can be fixed, but I don't think it's needed
            if ((lengthIn % 220) != 0)
            {
                return -1;
            }
            if (maxLen < ((lengthIn * 8) / 11))
            {
                return -1;
            }
            tmp_mem = (int32_t*)malloc(104 * sizeof(int32_t));

            for (size_t i = 0; i < lengthIn; i += 220)
            {
                WebRtcSpl_Resample22khzTo16khz(samplesIn + i, samplesOut + (i * 8) / 11,
                                               (WebRtcSpl_State22khzTo16khz *)state1_,
                                               tmp_mem);
            }
            outLen = (lengthIn * 8) / 11;
            free(tmp_mem);
            return 0;
            break;

    }
    return 0;
}